

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

size_t __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Rep *pRVar1;
  size_t sVar2;
  size_t sVar3;
  int i;
  long lVar4;
  
  sVar3 = (long)this->total_size_ << 3;
  pRVar1 = this->rep_;
  if (pRVar1 != (Rep *)0x0) {
    for (lVar4 = 0; lVar4 < pRVar1->allocated_size; lVar4 = lVar4 + 1) {
      sVar2 = StringTypeHandler::SpaceUsedLong((string *)pRVar1->elements[lVar4]);
      sVar3 = sVar3 + sVar2;
      pRVar1 = this->rep_;
    }
    sVar3 = sVar3 + 8;
  }
  return sVar3;
}

Assistant:

inline size_t RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() const {
  size_t allocated_bytes = total_size_ * sizeof(void*);
  if (rep_ != NULL) {
    for (int i = 0; i < rep_->allocated_size; ++i) {
      allocated_bytes += TypeHandler::SpaceUsedLong(
          *cast<TypeHandler>(rep_->elements[i]));
    }
    allocated_bytes += kRepHeaderSize;
  }
  return allocated_bytes;
}